

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalGhsMultiGenerator::AddExtraIDETargets(cmGlobalGhsMultiGenerator *this)

{
  cmGlobalGhsMultiGenerator *this_local;
  
  AddAllTarget(this);
  AddCheckTarget(this);
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::AddExtraIDETargets()
{
  // Add a special target that depends on ALL projects.
  this->AddAllTarget();

  /* Add Custom Target to check if CMake needs to be rerun.
   *
   * The build tool, currently, does not support rereading the project files
   * if they get updated.  So do not make the other targets dependent on this
   * check.
   */
  this->AddCheckTarget();
}